

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase988::run(TestCase988 *this)

{
  long lVar1;
  Reader data;
  byte b;
  undefined1 auStack_1b7 [15];
  OrphanBuilder local_1a8;
  anon_union_56_2_d657db04 anon_var_0;
  Builder root;
  MallocMessageBuilder builder;
  
  anon_var_0._32_8_ = 0x5555555555555555;
  anon_var_0._40_8_ = 0x5555555555555555;
  anon_var_0._16_8_ = 0x5555555555555555;
  anon_var_0._24_8_ = 0x5555555555555555;
  anon_var_0.align.content = (word)0x5555555555555555;
  anon_var_0._8_8_ = 0x5555555555555555;
  anon_var_0._48_2_ = 0x5555;
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  _b = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  data.super_ArrayPtr<const_unsigned_char>.size_ = 0x32;
  data.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)&anon_var_0;
  Orphanage::referenceExternalData((Orphan<capnp::Data> *)&local_1a8,(Orphanage *)&b,data);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptDataField
            (&root,(Orphan<capnp::Data> *)&local_1a8);
  OrphanBuilder::~OrphanBuilder(&local_1a8);
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataField(&root,(Reader)ZEXT816(0));
  for (lVar1 = 0; lVar1 != 0x32; lVar1 = lVar1 + 1) {
    b = anon_var_0.data[lVar1];
    if ((anon_var_0.data[lVar1] != 'U') && (kj::_::Debug::minSeverity < 3)) {
      local_1a8.tag.content._0_4_ = 0x55;
      kj::_::Debug::log<char_const(&)[31],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x3ee,ERROR,"\"failed: expected \" \"(0x55) == (b)\", 0x55, b",
                 (char (*) [31])"failed: expected (0x55) == (b)",(int *)&local_1a8,&b);
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, ReferenceExternalData_NoZeroOnSet) {
  // Verify that an external blob is not zeroed by setFoo().

  union {
    word align;
    byte data[50];
  };

  memset(data, 0x55, sizeof(data));

  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();
  root.adoptDataField(builder.getOrphanage().referenceExternalData(
      Data::Builder(data, sizeof(data))));

  root.setDataField(Data::Builder());

  for (byte b: data) {
    EXPECT_EQ(0x55, b);
  }
}